

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hybrid_node.hpp
# Opt level: O3

void __thiscall
ranger::bhvr_tree::
parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec(parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
             *ap,handler_type *hdl)

{
  handler_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar1;
  _Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
  _Var2;
  _Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
  _Var3;
  anon_class_64_4_ad5857ad local_90;
  function<void(bool,test_agent*)> local_50 [16];
  code *local_40;
  
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016f120;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var3._M_head_impl =
       (this->
       super_abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       ).m_first_child._M_t.
       super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
       .
       super__Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
       ._M_head_impl;
  if (_Var3._M_head_impl !=
      (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *)0x0) {
    lVar1 = 0;
    _Var2._M_head_impl = _Var3._M_head_impl;
    do {
      _Var2._M_head_impl =
           *(abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
             **)&(((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                    *)((long)_Var2._M_head_impl + 8))->_M_t).
                 super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
      ;
      lVar1 = lVar1 + -1;
    } while ((tuple<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
              )_Var2._M_head_impl !=
             (_Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
              )0x0);
    ((element_type *)(this_01 + 1))->count = (size_t)-lVar1;
    if (lVar1 != 0) {
      if (_Var3._M_head_impl !=
          (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *)0x0) {
        this_00 = &local_90.hdl;
        do {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
          local_90.ap = ap;
          local_90.data.
          super___shared_ptr<ranger::bhvr_tree::parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)(this_01 + 1);
          local_90.data.
          super___shared_ptr<ranger::bhvr_tree::parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = this_01;
          local_90.this = this;
          std::function<void_(bool,_test_agent_*)>::function(this_00,hdl);
          std::function<void(bool,test_agent*)>::
          function<ranger::bhvr_tree::parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
                    (local_50,&local_90);
          (**(code **)(*(long *)_Var3._M_head_impl + 0x10))(_Var3._M_head_impl,ap,local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(local_50,local_50,3);
          }
          if (local_90.hdl.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_90.hdl.super__Function_base._M_manager)
                      ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
          }
          if (local_90.data.
              super___shared_ptr<ranger::bhvr_tree::parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.data.
                       super___shared_ptr<ranger::bhvr_tree::parallel_hybrid_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>::internal_data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          _Var3._M_head_impl =
               *(abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                 **)&(((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                        *)((long)_Var3._M_head_impl + 8))->_M_t).
                     super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
          ;
        } while ((tuple<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                  )_Var3._M_head_impl !=
                 (_Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
                  )0x0);
      }
      goto LAB_00137687;
    }
  }
  std::function<void_(bool,_test_agent_*)>::operator()(hdl,this->m_count == 0,ap->m_agent);
LAB_00137687:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return;
}

Assistant:

void exec(AgentProxy& ap, typename AgentProxy::handler_type hdl) const final {
    auto data = std::make_shared<internal_data>();
    for (auto node = this->get_first_child(); node; node = node->get_next_sibling()) {
      ++data->count;
    }

    if (data->count > 0) {
      for (auto node = this->get_first_child(); node; node = node->get_next_sibling()) {
        node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
          std::lock_guard<mutex_type> lock(data->mtx);
          data->result += (result == m_expected ? 1 : 0);
          if (--data->count == 0) {
            ap(hdl, data->result == m_count);
          }
        });
      }
    } else {
      ap(hdl, data->result == m_count);
    }
  }